

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorStraightGradientInstancer::DecoratorStraightGradientInstancer
          (DecoratorStraightGradientInstancer *this)

{
  EffectSpecification *this_00;
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorStraightGradientInstancer_00396b50;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"direction",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"horizontal",&local_9a);
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"keyword",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"horizontal, vertical",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).direction = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"start-color",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"#ffffff",&local_9a);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"color",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).start = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"stop-color",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"#ffffff",&local_9a);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"color",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).stop = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"decorator",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"direction, start-color, stop-color",(allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand(this_00,&local_78,&local_98,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

DecoratorStraightGradientInstancer::DecoratorStraightGradientInstancer()
{
	ids.direction = RegisterProperty("direction", "horizontal").AddParser("keyword", "horizontal, vertical").GetId();
	ids.start = RegisterProperty("start-color", "#ffffff").AddParser("color").GetId();
	ids.stop = RegisterProperty("stop-color", "#ffffff").AddParser("color").GetId();
	RegisterShorthand("decorator", "direction, start-color, stop-color", ShorthandType::FallThrough);
}